

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O2

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_removeNode
          (DependenceGraph<dg::LLVMNode> *this,KeyT k,ContainerType *cont)

{
  LLVMNode *pLVar1;
  iterator it;
  iterator local_20;
  KeyT local_18;
  
  local_18 = k;
  local_20._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::LLVMNode_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
       ::find(&cont->_M_t,&local_18);
  if ((_Rb_tree_header *)local_20._M_node == &(cont->_M_t)._M_impl.super__Rb_tree_header) {
    pLVar1 = (LLVMNode *)0x0;
  }
  else {
    pLVar1 = _removeNode(this,&local_20,cont);
  }
  return pLVar1;
}

Assistant:

NodeT *_removeNode(KeyT k, ContainerType *cont) {
        iterator it = cont->find(k);
        if (it == cont->end())
            return nullptr;

        // remove and re-connect edges
        return _removeNode(it, cont);
    }